

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * comma_expression(dmr_C *C,token *token,expression **tree)

{
  position pVar1;
  int iVar2;
  token *ptVar3;
  expression *peVar4;
  char *pcVar5;
  expression *peVar6;
  expression *local_40;
  expression *left;
  expression *right;
  
  local_40 = (expression *)0x0;
  ptVar3 = dmrC_assignment_expression(C,token,&local_40);
  if (local_40 != (expression *)0x0) {
    peVar6 = local_40;
    do {
      if (((ulong)ptVar3->pos & 0x3f) != 0x11) goto LAB_00108e61;
      left = (expression *)0x0;
      iVar2 = 4;
      if ((ptVar3->field_2).special == 0x2c) {
        pVar1 = ptVar3->pos;
        peVar4 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)peVar4 = 0x15;
        peVar4->pos = pVar1;
        ptVar3 = dmrC_assignment_expression(C,ptVar3->next,&left);
        if (left == (expression *)0x0) {
          pcVar5 = dmrC_show_special(C,0x2c);
          dmrC_sparse_error(C,ptVar3->pos,"No right hand side of \'%s\'-expression",pcVar5);
          iVar2 = 3;
        }
        else {
          peVar4->field_0x1 =
               (byte)((ushort)*(undefined2 *)peVar6 >> 8) & (byte)((ushort)*(undefined2 *)left >> 8)
               & 1;
          peVar4->op = 0x2c;
          (peVar4->field_5).field_3.unop = peVar6;
          (peVar4->field_5).field_6.right = left;
          iVar2 = 0;
          peVar6 = peVar4;
          local_40 = peVar4;
        }
      }
    } while (iVar2 == 0);
    if (1 < iVar2 - 3U) {
      return ptVar3;
    }
  }
LAB_00108e61:
  *tree = local_40;
  return ptVar3;
}

Assistant:

static struct token *comma_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_COMMA, dmrC_assignment_expression,
		(op == ',')
	);
}